

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O0

void flatbuffers::tests::proto_test_union_id(string *proto_path,string *proto_file)

{
  bool expval;
  flatbuffers *this;
  string *in_RCX;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  string golden_file;
  IDLOptions opts;
  string *proto_file_local;
  string *proto_path_local;
  
  IDLOptions::IDLOptions((IDLOptions *)((long)&golden_file.field_2 + 8));
  std::__cxx11::string::string((string *)local_348);
  std::operator+(&local_368,proto_path,"test_union_id.golden.fbs");
  this = (flatbuffers *)std::__cxx11::string::c_str();
  expval = LoadFile(this,(char *)0x0,SUB81(local_348,0),in_RCX);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile((proto_path + \"test_union_id.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x71,"");
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string((string *)&local_398);
  RunTest((IDLOptions *)((long)&golden_file.field_2 + 8),proto_path,proto_file,(string *)local_348,
          &local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)local_348);
  IDLOptions::~IDLOptions((IDLOptions *)((long)&golden_file.field_2 + 8));
  return;
}

Assistant:

void proto_test_union_id(const std::string &proto_path,
                         const std::string &proto_file) {
  // Parse proto with --oneof-union option.
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = false;
  opts.proto_mode = true;
  opts.proto_oneof_union = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  std::string golden_file;
  TEST_EQ(
      flatbuffers::LoadFile((proto_path + "test_union_id.golden.fbs").c_str(),
                            false, &golden_file),
      true);
  RunTest(opts, proto_path, proto_file, golden_file);
}